

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void __thiscall FDecalLib::ReadAllDecals(FDecalLib *this)

{
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  FDecalAnimator **ppFVar5;
  PClassActor **ppPVar6;
  char *name;
  FDecalBase *pFVar7;
  FName local_13c;
  AActor *pAStack_138;
  FName v;
  AActor *def;
  undefined1 local_120 [8];
  FScanner sc;
  uint i_1;
  uint i;
  int lastlump;
  int lump;
  FDecalLib *this_local;
  
  i_1 = 0;
  _lastlump = this;
  for (sc.LastGotLine = 0; iVar1 = sc.LastGotLine,
      uVar4 = TArray<FDecalAnimator_*,_FDecalAnimator_*>::Size
                        (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>),
      (uint)iVar1 < uVar4; sc.LastGotLine = sc.LastGotLine + 1) {
    ppFVar5 = TArray<FDecalAnimator_*,_FDecalAnimator_*>::operator[]
                        (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,
                         (ulong)(uint)sc.LastGotLine);
    if (*ppFVar5 != (FDecalAnimator *)0x0) {
      (*(*ppFVar5)->_vptr_FDecalAnimator[1])();
    }
  }
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Clear
            (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>);
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Clear(&FDecalCombinerAnim::AnimatorList);
  TArray<unsigned_char,_unsigned_char>::Clear(&DecalTranslations);
  Clear(&DecalLibrary);
  while (i = FWadCollection::FindLump(&Wads,"DECALDEF",(int *)&i_1,false), i != 0xffffffff) {
    FScanner::FScanner((FScanner *)local_120,i);
    ReadDecals(this,(FScanner *)local_120);
    FScanner::~FScanner((FScanner *)local_120);
  }
  sc.CMode = false;
  sc.StateMode = '\0';
  sc.StateOptions = false;
  sc.Escape = false;
  i = 0xffffffff;
  for (; uVar2 = sc._252_4_,
      uVar4 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
      (uint)uVar2 < uVar4; sc._252_4_ = sc._252_4_ + 1) {
    ppPVar6 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                        (&PClassActor::AllActorClasses,(ulong)(uint)sc._252_4_);
    pAStack_138 = GetDefaultByType(&(*ppPVar6)->super_PClass);
    FName::FName(&local_13c,(ENamedName)pAStack_138->DecalGenerator);
    bVar3 = FName::IsValidName(&local_13c);
    if (bVar3) {
      name = FName::operator_cast_to_char_(&local_13c);
      pFVar7 = ScanTreeForName(name,this->Root);
      pAStack_138->DecalGenerator = pFVar7;
    }
  }
  return;
}

Assistant:

void FDecalLib::ReadAllDecals ()
{
	int lump, lastlump = 0;
	unsigned int i;

	for(unsigned i=0;i<Animators.Size(); i++)
	{
		delete Animators[i];
	}
	Animators.Clear();
	FDecalCombinerAnim::AnimatorList.Clear();
	DecalTranslations.Clear();

	DecalLibrary.Clear();

	while ((lump = Wads.FindLump ("DECALDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		ReadDecals (sc);
	}
	// Supporting code to allow specifying decals directly in the DECORATE lump
	for (i = 0; i < PClassActor::AllActorClasses.Size(); i++)
	{
		AActor *def = (AActor*)GetDefaultByType (PClassActor::AllActorClasses[i]);

		FName v = ENamedName(intptr_t(def->DecalGenerator));
		if (v.IsValidName())
		{
			def->DecalGenerator = ScanTreeForName (v, Root);
		}
	}
}